

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AutoDeleteTempFile.cpp
# Opt level: O0

void __thiscall
MILBlob::TestUtil::AutoDeleteTempFile::AutoDeleteTempFile(AutoDeleteTempFile *this,FileType type)

{
  int iVar1;
  char *pcVar2;
  runtime_error *prVar3;
  invalid_argument *this_00;
  allocator<char> local_15;
  FileType local_14;
  AutoDeleteTempFile *pAStack_10;
  FileType type_local;
  AutoDeleteTempFile *this_local;
  
  local_14 = type;
  pAStack_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)this,"/tmp/com.apple.mil.test_file_temp.XXXXXX",&local_15);
  std::allocator<char>::~allocator(&local_15);
  this->m_fileDescriptor = -1;
  if (local_14 == FILE) {
    pcVar2 = (char *)std::__cxx11::string::data();
    iVar1 = mkstemp(pcVar2);
    this->m_fileDescriptor = iVar1;
    if (this->m_fileDescriptor == -1) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"unable to generate temporary filename");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    if (local_14 != DIR) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Invalid requested file type");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pcVar2 = (char *)std::__cxx11::string::data();
    pcVar2 = mkdtemp(pcVar2);
    if (pcVar2 == (char *)0x0) {
      prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar3,"unable to generate temporary directory");
      __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pcVar2 = (char *)std::__cxx11::string::data();
    chmod(pcVar2,0x1ed);
  }
  return;
}

Assistant:

AutoDeleteTempFile::AutoDeleteTempFile(FileType type)
    : m_filename("/tmp/com.apple.mil.test_file_temp.XXXXXX")
    , m_fileDescriptor(-1)
{
    switch (type) {
        case FILE:
        {
            m_fileDescriptor = mkstemp(m_filename.data());
            if (m_fileDescriptor == -1) {
                throw std::runtime_error("unable to generate temporary filename");
            }
            break;
        }
        case DIR:
        {
            if (mkdtemp(m_filename.data()) == nullptr) {
                throw std::runtime_error("unable to generate temporary directory");
            }
            chmod(m_filename.data(), S_IRUSR | S_IWUSR | S_IXUSR | S_IRGRP | S_IXGRP | S_IROTH | S_IXOTH);
            break;
        }
        default:
            throw std::invalid_argument("Invalid requested file type");
    }
}